

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * store_type_to_str(store_type stype)

{
  char *pcStack_10;
  store_type stype_local;
  
  switch(stype) {
  case UNBOUNDED_MAPSTORE:
    pcStack_10 = "UNBOUNDED MAPSTORE";
    break;
  case COLLAPSINGHIGH_MAPSTORE:
    pcStack_10 = "HIGH COLLAPSING MAPSTORE";
    break;
  case COLLAPSINGLOW_MAPSTORE:
    pcStack_10 = "LOW COLLAPSING MAPSTORE";
    break;
  case COLLAPSINGALL_MAPSTORE:
    pcStack_10 = "UNIFORM COLLAPSING MAPSTORE";
    break;
  case 4:
    pcStack_10 = "UNIFORM COLLAPSING WITH INITIAL ALPHA";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

char *store_type_to_str(enum store_type stype){
    switch (stype) {
        case UNBOUNDED_MAPSTORE:
            return "UNBOUNDED MAPSTORE";
        case COLLAPSINGHIGH_MAPSTORE:
            return "HIGH COLLAPSING MAPSTORE";
        case COLLAPSINGLOW_MAPSTORE:
            return "LOW COLLAPSING MAPSTORE";
        case COLLAPSINGALL_MAPSTORE:
            return "UNIFORM COLLAPSING MAPSTORE";
        case UNIFORM_WITH_INITIAL_ALPHA:
            return "UNIFORM COLLAPSING WITH INITIAL ALPHA";
        default:
            return NULL;
    }
}